

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SimpleSignal.h
# Opt level: O0

size_t __thiscall
Simple::Lib::ProtoSignal<int_(),_Simple::CollectorVector<int>_>::SignalLink::add_before
          (SignalLink *this,CbFunction *cb)

{
  SignalLink *this_00;
  SignalLink *link;
  CbFunction *cb_local;
  SignalLink *this_local;
  
  this_00 = (SignalLink *)operator_new(0x38);
  SignalLink(this_00,cb);
  this_00->prev = this->prev;
  this_00->next = this;
  this->prev->next = this_00;
  this->prev = this_00;
  return (size_t)this_00;
}

Assistant:

size_t
    add_before (const CbFunction &cb)
    {
      SignalLink *link = new SignalLink (cb);
      link->prev = prev; // link to last
      link->next = this;
      prev->next = link; // link from last
      prev = link;
      static_assert (sizeof (link) == sizeof (size_t), "sizeof size_t");
      return size_t (link);
    }